

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogDerivativesPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *postOrderPartial,float *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          float *categoryWeights,int scalingFactorsIndex,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  long lVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  float *pfVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long local_80;
  float *local_78;
  
  iVar3 = this->kCategoryCount;
  if (0 < (long)iVar3) {
    iVar4 = this->kMatrixSize;
    uVar5 = this->kStateCount;
    pfVar7 = this->grandNumeratorDerivTmp;
    iVar10 = 0;
    local_80 = 0;
    pfVar8 = this->gTransitionMatrices[firstDerivativeIndex];
    uVar6 = this->kPatternCount;
    lVar13 = (long)this->kPartialsPaddedStateCount;
    pfVar9 = this->grandDenominatorDerivTmp;
    local_78 = postOrderPartial;
    do {
      if (0 < (int)uVar6) {
        uVar15 = 0;
        fVar2 = categoryWeights[local_80];
        pfVar16 = local_78;
        do {
          if ((int)uVar5 < 1) {
            auVar18 = ZEXT816(0);
            auVar17 = ZEXT816(0);
          }
          else {
            auVar17 = ZEXT816(0);
            auVar18 = ZEXT816(0);
            uVar11 = 0;
            iVar12 = iVar10;
            do {
              auVar19 = ZEXT816(0) << 0x40;
              uVar14 = 0;
              do {
                auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)pfVar8[(long)iVar12 + uVar14]),
                                          ZEXT416((uint)pfVar16[uVar14]));
                uVar14 = uVar14 + 1;
              } while (uVar5 != uVar14);
              lVar1 = uVar11 + (local_80 * (int)uVar6 + uVar15) * lVar13;
              uVar11 = uVar11 + 1;
              iVar12 = iVar12 + uVar5 + 1;
              auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)preOrderPartial[lVar1]),
                                        ZEXT416((uint)postOrderPartial[lVar1]));
              auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)preOrderPartial[lVar1]),auVar19);
            } while (uVar11 != uVar5);
          }
          auVar18 = vfmadd213ss_fma(auVar18,ZEXT416((uint)fVar2),ZEXT416((uint)pfVar7[uVar15]));
          pfVar16 = pfVar16 + lVar13;
          pfVar7[uVar15] = auVar18._0_4_;
          auVar17 = vfmadd213ss_fma(auVar17,ZEXT416((uint)fVar2),ZEXT416((uint)pfVar9[uVar15]));
          pfVar9[uVar15] = auVar17._0_4_;
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar6);
      }
      iVar10 = iVar10 + iVar4;
      local_78 = local_78 + (int)uVar6 * lVar13;
      local_80 = local_80 + 1;
    } while (local_80 != iVar3);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesPartials(const REALTYPE *postOrderPartial,
                                                                       const REALTYPE *preOrderPartial,
                                                                       const int firstDerivativeIndex,
                                                                       const int secondDerivativeIndex,
                                                                       const double *categoryRates,
                                                                       const REALTYPE *categoryWeights,
                                                                       const int scalingFactorsIndex,
//                                                                       const REALTYPE *cumulativeScaleBuffer,
                                                                       double *outDerivatives,
                                                                       double *outSumDerivatives,
                                                                       double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {
        const REALTYPE weight = categoryWeights[category];

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            int w = category * kMatrixSize;

            const int patternIndex = category * kPatternCount + pattern;
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE numerator = 0.0;
            REALTYPE denominator = 0.0;

            for (int k = 0; k < kStateCount; k++) {

                REALTYPE sumOverEndState = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sumOverEndState += firstDerivMatrix[w]
                                       * postOrderPartial[v + j]; // fix padded index
                    w++;
                }
                w += T_PAD;

                numerator += sumOverEndState * preOrderPartial[v + k];
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }

            grandNumeratorDerivTmp[pattern] += weight * numerator;
            grandDenominatorDerivTmp[pattern] += weight * denominator;
        }
    }
}